

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *args_4;
  StreamingConcatenationExpressionSyntax *pSVar1;
  Token local_88;
  Token local_78;
  DeepCloneVisitor visitor;
  SyntaxNode *local_58;
  Token local_50;
  Token local_40;
  
  local_78 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_88 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_58 = (SyntaxNode *)0x0;
  }
  else {
    local_58 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::StreamExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)(__fn + 0x50),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StreamingConcatenationExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_78,&local_88,
                      (ExpressionSyntax **)&local_58,(Token *)&visitor,args_4,&local_40,&local_50);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StreamingConcatenationExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StreamingConcatenationExpressionSyntax>(
        node.openBrace.deepClone(alloc),
        node.operatorToken.deepClone(alloc),
        node.sliceSize ? deepClone(*node.sliceSize, alloc) : nullptr,
        node.innerOpenBrace.deepClone(alloc),
        *deepClone(node.expressions, alloc),
        node.innerCloseBrace.deepClone(alloc),
        node.closeBrace.deepClone(alloc)
    );
}